

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlabel.cpp
# Opt level: O2

QSize __thiscall QLabelPrivate::sizeForWidth(QLabelPrivate *this,int w)

{
  short sVar1;
  short sVar2;
  long lVar3;
  QWidget *this_00;
  qreal width;
  double dVar4;
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  char cVar9;
  bool bVar10;
  int iVar11;
  int iVar12;
  LayoutDirection direction;
  Alignment AVar13;
  QSize QVar14;
  long lVar15;
  QStyle *pQVar16;
  Representation RVar17;
  Representation RVar18;
  int iVar19;
  ulong uVar20;
  int iVar21;
  uint uVar22;
  int iVar23;
  QWidgetTextControl *this_01;
  uint uVar24;
  QString *text;
  ulong uVar25;
  byte bVar26;
  Representation RVar27;
  int iVar28;
  long in_FS_OFFSET;
  QRect QVar29;
  QSizeF QVar30;
  uint local_b8;
  QSizeF local_90;
  QFontMetrics fm;
  QStyleOption opt;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&(this->super_QFramePrivate).super_QWidgetPrivate.field_0x8;
  QVar14 = QWidget::minimumSize(this_00);
  if (0 < QVar14.wd.m_i.m_i) {
    QVar14 = QWidget::minimumSize(this_00);
    if (w < QVar14.wd.m_i.m_i) {
      w = QVar14.wd.m_i.m_i;
    }
  }
  iVar21 = (int)(this->super_QFramePrivate).super_QWidgetPrivate.rightmargin +
           (int)(this->super_QFramePrivate).super_QWidgetPrivate.leftmargin;
  sVar1 = (this->super_QFramePrivate).super_QWidgetPrivate.topmargin;
  sVar2 = (this->super_QFramePrivate).super_QWidgetPrivate.bottommargin;
  iVar19 = this->margin * 2;
  _fm = &DAT_aaaaaaaaaaaaaaaa;
  QWidget::fontMetrics((QWidget *)&fm);
  iVar23 = iVar19;
  if ((this->icon).super__Optional_base<QIcon,_false,_false>._M_payload.
      super__Optional_payload<QIcon,_true,_false,_false>.super__Optional_payload_base<QIcon>.
      _M_engaged == true) {
    std::_Optional_base_impl<QIcon,_std::_Optional_base<QIcon,_false,_false>_>::_M_get
              ((_Optional_base_impl<QIcon,_std::_Optional_base<QIcon,_false,_false>_> *)&this->icon)
    ;
    cVar9 = QIcon::isNull();
    if (cVar9 == '\0') {
      auVar6._4_4_ = (this->pixmapSize).ht.m_i + -1;
      auVar6._0_4_ = (this->pixmapSize).wd.m_i + -1;
      auVar6._8_8_ = 0;
      QVar29 = (QRect)(auVar6 << 0x40);
      goto LAB_003e3c1c;
    }
  }
  if ((this->picture).super__Optional_base<QPicture,_false,_false>._M_payload.
      super__Optional_payload<QPicture,_true,_false,_false>.super__Optional_payload_base<QPicture>.
      _M_engaged == true) {
    std::_Optional_base_impl<QPicture,_std::_Optional_base<QPicture,_false,_false>_>::_M_get
              ((_Optional_base_impl<QPicture,_std::_Optional_base<QPicture,_false,_false>_> *)
               &this->picture);
    cVar9 = QPicture::isNull();
    if (cVar9 == '\0') {
      std::_Optional_base_impl<QPicture,_std::_Optional_base<QPicture,_false,_false>_>::_M_get
                ((_Optional_base_impl<QPicture,_std::_Optional_base<QPicture,_false,_false>_> *)
                 &this->picture);
      QVar29 = (QRect)QPicture::boundingRect();
      goto LAB_003e3c1c;
    }
  }
  bVar10 = QPointer::operator_cast_to_bool((QPointer *)&this->movie);
  if (bVar10) {
    QMovie::currentPixmap();
    cVar9 = QPixmap::isNull();
    QPixmap::~QPixmap((QPixmap *)&opt);
    if (cVar9 == '\0') {
      QMovie::currentPixmap();
      lVar15 = QPixmap::rect();
      QPixmap::~QPixmap((QPixmap *)&opt);
      QMovie::currentPixmap();
      local_90.wd = (qreal)QPixmap::deviceIndependentSize();
      QVar14 = QSizeF::toSize(&local_90);
      uVar20 = lVar15 + -0x100000000 + ((ulong)QVar14 & 0xffffffff00000000) & 0xffffffff00000000 |
               (ulong)(((int)lVar15 + QVar14.wd.m_i.m_i) - 1);
      QVar29.x2.m_i = (int)uVar20;
      QVar29.y2.m_i = (int)(uVar20 >> 0x20);
      QVar29.x1.m_i = (int)lVar15;
      QVar29.y1.m_i = (int)((ulong)lVar15 >> 0x20);
      QPixmap::~QPixmap((QPixmap *)&opt);
      goto LAB_003e3c1c;
    }
  }
  if ((this->field_0x340 & 0x10) == 0) {
    iVar11 = QFontMetrics::averageCharWidth();
    iVar12 = QFontMetrics::lineSpacing();
    auVar8._4_4_ = iVar12 + -1;
    auVar8._0_4_ = iVar11 + -1;
    auVar8._8_8_ = 0;
    QVar29 = (QRect)(auVar8 << 0x40);
    goto LAB_003e3c1c;
  }
  direction = textDirection(this);
  AVar13 = QStyle::visualAlignment(direction,(Alignment)this->align);
  iVar11 = this->indent;
  if (iVar11 < 0) {
    iVar11 = QFrame::frameWidth((QFrame *)this_00);
    if (iVar11 != 0) {
      iVar11 = QFontMetrics::horizontalAdvance((QChar)(char16_t)&fm);
      iVar11 = iVar11 + this->margin * -2;
      goto LAB_003e3876;
    }
  }
  else {
LAB_003e3876:
    if (0 < iVar11) {
      iVar23 = iVar11 + iVar19;
      if (((uint)AVar13.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
                 super_QFlagsStorage<Qt::AlignmentFlag>.i & 3) == 0) {
        iVar23 = iVar19;
      }
      if (((uint)AVar13.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
                 super_QFlagsStorage<Qt::AlignmentFlag>.i & 0x60) != 0) {
        iVar19 = iVar11 + iVar19;
      }
    }
  }
  if (this->control == (QWidgetTextControl *)0x0) {
    uVar22 = (uint)AVar13.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
                   super_QFlagsStorage<Qt::AlignmentFlag>.i & 0xffffff7b;
    if ((this->field_0x340 & 0x20) != 0) {
      opt.palette._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      opt.styleObject = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
      opt._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
      opt.palette.d = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
      opt.rect._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      opt.rect._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      opt._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      opt._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_b8 = (uint)AVar13.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
                       super_QFlagsStorage<Qt::AlignmentFlag>.i & 0xffffff7b;
      QStyleOption::QStyleOption(&opt,1,0);
      QStyleOption::initFrom(&opt,this_00);
      pQVar16 = QWidget::style(this_00);
      iVar11 = (**(code **)(*(long *)pQVar16 + 0xf0))(pQVar16,0x29,&opt,this_00,0);
      uVar22 = (uint)(iVar11 == 0) << 0xf | local_b8 | 0x800;
      QStyleOption::~QStyleOption(&opt);
    }
    bVar26 = (byte)((uint)AVar13.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
                          super_QFlagsStorage<Qt::AlignmentFlag>.i >> 0xc) & 1 & w < 0;
    if (bVar26 == 1) {
      iVar11 = QFontMetrics::averageCharWidth();
      QVar14 = QWidget::maximumSize(this_00);
      RVar17.m_i = QVar14.wd.m_i.m_i;
      if (iVar11 * 0x50 < QVar14.wd.m_i.m_i) {
        RVar17.m_i = iVar11 * 0x50;
      }
    }
    else {
      RVar17.m_i = 2000;
      if (-1 < w) {
        RVar17.m_i = w;
      }
    }
    iVar11 = RVar17.m_i - (iVar23 + iVar21);
    text = &this->text;
    QVar29 = QFontMetrics::boundingRect(&fm,0,0,iVar11,2000,uVar22,text,0,(int *)0x0);
    if (bVar26 != 0) {
      RVar18 = QVar29.y1.m_i;
      RVar27 = QVar29.y2.m_i;
      iVar28 = (RVar27.m_i - RVar18.m_i) + 1;
      iVar12 = QFontMetrics::lineSpacing();
      if ((SBORROW4(iVar28,iVar12 * 4) != iVar28 + iVar12 * -4 < 0) &&
         (iVar11 / 2 < (QVar29.x2.m_i.m_i - QVar29.x1.m_i) + 1)) {
        QVar29 = QFontMetrics::boundingRect(&fm,0,0,iVar11 / 2,2000,uVar22,text,0,(int *)0x0);
        RVar27 = QVar29.y2.m_i;
        RVar18 = QVar29.y1.m_i;
      }
      iVar28 = (RVar27.m_i - RVar18.m_i) + 1;
      iVar12 = QFontMetrics::lineSpacing();
      if ((SBORROW4(iVar28,iVar12 * 2) != iVar28 + iVar12 * -2 < 0) &&
         (iVar11 / 4 < (QVar29.x2.m_i.m_i - QVar29.x1.m_i) + 1)) {
        QVar29 = QFontMetrics::boundingRect(&fm,0,0,iVar11 / 4,2000,uVar22,text,0,(int *)0x0);
      }
    }
    goto LAB_003e3c1c;
  }
  ensureTextLayouted(this);
  width = QWidgetTextControl::textWidth((QWidgetTextControl *)this->control);
  if (((uint)AVar13.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
             super_QFlagsStorage<Qt::AlignmentFlag>.i >> 0xc & 1) == 0) {
    this_01 = (QWidgetTextControl *)this->control;
    dVar4 = -1.0;
LAB_003e3abf:
    QWidgetTextControl::setTextWidth(this_01,dVar4);
  }
  else {
    if (-1 < w) {
      iVar12 = w - (iVar23 + iVar21);
      iVar11 = 0;
      if (0 < iVar12) {
        iVar11 = iVar12;
      }
      this_01 = (QWidgetTextControl *)this->control;
      dVar4 = (double)iVar11;
      goto LAB_003e3abf;
    }
    QWidgetTextControl::adjustSize((QWidgetTextControl *)this->control);
  }
  QVar30 = QWidgetTextControl::size((QWidgetTextControl *)this->control);
  dVar4 = ceil(QVar30.wd);
  dVar5 = ceil(QVar30.ht);
  auVar7._4_4_ = (int)dVar5 + -1;
  auVar7._0_4_ = (int)dVar4 + -1;
  QWidgetTextControl::setTextWidth((QWidgetTextControl *)this->control,width);
  auVar7._8_8_ = 0;
  QVar29 = (QRect)(auVar7 << 0x40);
LAB_003e3c1c:
  uVar24 = iVar23 + (iVar21 - QVar29.x1.m_i) + QVar29.x2.m_i.m_i + 1;
  uVar22 = QVar29.y2.m_i.m_i + (((int)sVar1 + (int)sVar2) - QVar29.y1.m_i) + iVar19 + 1;
  QVar14 = QWidget::minimumSize(this_00);
  uVar20 = (ulong)QVar14 >> 0x20;
  uVar25 = (ulong)uVar24;
  if ((int)uVar24 <= QVar14.wd.m_i.m_i) {
    uVar25 = (ulong)QVar14 & 0xffffffff;
  }
  if (QVar14.ht.m_i.m_i < (int)uVar22) {
    uVar20 = (ulong)uVar22;
  }
  QFontMetrics::~QFontMetrics(&fm);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return (QSize)(uVar25 | uVar20 << 0x20);
  }
  __stack_chk_fail();
}

Assistant:

QSize QLabelPrivate::sizeForWidth(int w) const
{
    Q_Q(const QLabel);
    if (q->minimumWidth() > 0)
        w = qMax(w, q->minimumWidth());
    QSize contentsMargin(leftmargin + rightmargin, topmargin + bottommargin);

    QRect br;

    int hextra = 2 * margin;
    int vextra = hextra;
    QFontMetrics fm = q->fontMetrics();

    if (icon && !icon->isNull()) {
        br = QRect(QPoint(0, 0), pixmapSize);
#ifndef QT_NO_PICTURE
    } else if (picture && !picture->isNull()) {
        br = picture->boundingRect();
#endif
#if QT_CONFIG(movie)
    } else if (movie && !movie->currentPixmap().isNull()) {
        br = movie->currentPixmap().rect();
        br.setSize(movie->currentPixmap().deviceIndependentSize().toSize());
#endif
    } else if (isTextLabel) {
        int align = QStyle::visualAlignment(textDirection(), QFlag(this->align));
        // Add indentation
        int m = indent;

        if (m < 0 && q->frameWidth()) // no indent, but we do have a frame
            m = fm.horizontalAdvance(u'x') - margin*2;
        if (m > 0) {
            if ((align & Qt::AlignLeft) || (align & Qt::AlignRight))
                hextra += m;
            if ((align & Qt::AlignTop) || (align & Qt::AlignBottom))
                vextra += m;
        }

        if (control) {
            ensureTextLayouted();
            const qreal oldTextWidth = control->textWidth();
            // Calculate the length of document if w is the width
            if (align & Qt::TextWordWrap) {
                if (w >= 0) {
                    w = qMax(w-hextra-contentsMargin.width(), 0); // strip margin and indent
                    control->setTextWidth(w);
                } else {
                    control->adjustSize();
                }
            } else {
                control->setTextWidth(-1);
            }

            QSizeF controlSize = control->size();
            br = QRect(QPoint(0, 0), QSize(qCeil(controlSize.width()), qCeil(controlSize.height())));

            // restore state
            control->setTextWidth(oldTextWidth);
        } else {
            // Turn off center alignment in order to avoid rounding errors for centering,
            // since centering involves a division by 2. At the end, all we want is the size.
            int flags = align & ~(Qt::AlignVCenter | Qt::AlignHCenter);
            if (hasShortcut) {
                flags |= Qt::TextShowMnemonic;
                QStyleOption opt;
                opt.initFrom(q);
                if (!q->style()->styleHint(QStyle::SH_UnderlineShortcut, &opt, q))
                    flags |= Qt::TextHideMnemonic;
            }

            bool tryWidth = (w < 0) && (align & Qt::TextWordWrap);
            if (tryWidth)
                w = qMin(fm.averageCharWidth() * 80, q->maximumSize().width());
            else if (w < 0)
                w = 2000;
            w -= (hextra + contentsMargin.width());
            br = fm.boundingRect(0, 0, w ,2000, flags, text);
            if (tryWidth && br.height() < 4*fm.lineSpacing() && br.width() > w/2)
                br = fm.boundingRect(0, 0, w/2, 2000, flags, text);
            if (tryWidth && br.height() < 2*fm.lineSpacing() && br.width() > w/4)
                br = fm.boundingRect(0, 0, w/4, 2000, flags, text);
        }
    } else {
        br = QRect(QPoint(0, 0), QSize(fm.averageCharWidth(), fm.lineSpacing()));
    }

    const QSize contentsSize(br.width() + hextra, br.height() + vextra);
    return (contentsSize + contentsMargin).expandedTo(q->minimumSize());
}